

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecSimulationDataGenerator.cpp
# Opt level: O3

void __thiscall
HdmiCecSimulationDataGenerator::GenDataBlock
          (HdmiCecSimulationDataGenerator *this,U8 data,bool eom,bool ack)

{
  undefined7 in_register_00000031;
  int i;
  uint uVar1;
  bool bVar2;
  
  uVar1 = 7;
  do {
    GenBit(this,((uint)CONCAT71(in_register_00000031,data) >> (uVar1 & 0x1f) & 1) != 0,false);
    bVar2 = uVar1 != 0;
    uVar1 = uVar1 - 1;
  } while (bVar2);
  if (this->mErrorType == ERR_NOEOM) {
    this->mErrorType = ERR_NOERROR;
  }
  else {
    GenBit(this,eom,false);
    if (this->mErrorType == ERR_NOACK) {
      this->mErrorType = ERR_NOERROR;
      return;
    }
  }
  GenBit(this,ack,true);
  return;
}

Assistant:

void HdmiCecSimulationDataGenerator::GenDataBlock( U8 data, bool eom, bool ack )
{
    for( int i = 7; i >= 0; i-- )
        GenBit( ( data >> i ) & 0x1 );

    if( mErrorType != ERR_NOEOM )
        GenBit( eom );
    else
        mErrorType = ERR_NOERROR;

    if( mErrorType != ERR_NOACK )
        GenBit( ack, true );
    else
        mErrorType = ERR_NOERROR;
}